

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnNameEntry
          (BinaryReaderIR *this,NameSectionSubsection type,Index index,string_view name)

{
  pointer ppTVar1;
  TypeEntry *pTVar2;
  pointer ppEVar3;
  ElemSegment *pEVar4;
  pointer ppMVar5;
  Memory *pMVar6;
  pointer ppDVar7;
  DataSegment *pDVar8;
  Module *pMVar9;
  pointer ppTVar10;
  Tag *pTVar11;
  char *pcVar12;
  long lVar13;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string dollar_name;
  string local_78;
  string local_58;
  Index local_38;
  
  pcVar12 = name._M_str;
  name_00._M_str = (string *)name._M_len;
  if (6 < type - Type) {
    return (Result)Ok;
  }
  switch(type) {
  case Type:
    if (name_00._M_str == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppTVar1 = (pMVar9->types).
              super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->types).
                      super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)) {
      pTVar2 = ppTVar1[index];
      name_00._M_len = (size_t)pcVar12;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_
                (&local_58,(_anonymous_namespace_ *)name_00._M_str,name_00);
      GetUniqueName(&local_78,(BinaryReaderIR *)&pMVar9->type_bindings,(BindingHash *)&local_58,
                    name_00._M_str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                 local_58.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::string::_M_assign((string *)&pTVar2->name);
      lVar13 = 600;
LAB_0011dd0d:
      local_58.field_2._M_allocated_capacity._0_4_ = 0;
      local_58.field_2._M_allocated_capacity._4_4_ = 0;
      local_58.field_2._8_4_ = 0;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length._0_4_ = 0;
      local_58._M_string_length._4_4_ = 0;
      local_38 = index;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)((long)&(this->module_->loc).filename._M_len + lVar13),0,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return (Result)Ok;
      }
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      return (Result)Ok;
    }
    pcVar12 = "invalid type index: %u";
    break;
  case Table:
    SetTableName(this,index,name);
    return (Result)Ok;
  case Memory:
    if (name_00._M_str == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppMVar5 = (pMVar9->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppMVar5 >> 3)) {
      pMVar6 = ppMVar5[index];
      name_02._M_str = (char *)name_00._M_str;
      name_02._M_len = (size_t)pcVar12;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_
                (&local_58,(_anonymous_namespace_ *)name_00._M_str,name_02);
      GetUniqueName(&local_78,(BinaryReaderIR *)&pMVar9->memory_bindings,(BindingHash *)&local_58,
                    name_00._M_str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                 local_58.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::string::_M_assign((string *)pMVar6);
      lVar13 = 0x2c8;
      goto LAB_0011dd0d;
    }
    pcVar12 = "invalid memory index: %u";
    break;
  case Global:
    SetGlobalName(this,index,name);
    return (Result)Ok;
  case ElemSegment:
    if (name_00._M_str == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppEVar3 = (pMVar9->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->elem_segments).
                      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3)) {
      pEVar4 = ppEVar3[index];
      name_01._M_str = (char *)name_00._M_str;
      name_01._M_len = (size_t)pcVar12;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_
                (&local_58,(_anonymous_namespace_ *)name_00._M_str,name_01);
      GetUniqueName(&local_78,(BinaryReaderIR *)&pMVar9->elem_segment_bindings,
                    (BindingHash *)&local_58,name_00._M_str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                 local_58.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::string::_M_assign((string *)&pEVar4->name);
      lVar13 = 0x338;
      goto LAB_0011dd0d;
    }
    pcVar12 = "invalid elem segment index: %u";
    break;
  case DataSegment:
    if (name_00._M_str == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppDVar7 = (pMVar9->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->data_segments).
                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar7 >> 3)) {
      pDVar8 = ppDVar7[index];
      name_03._M_str = (char *)name_00._M_str;
      name_03._M_len = (size_t)pcVar12;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_
                (&local_58,(_anonymous_namespace_ *)name_00._M_str,name_03);
      GetUniqueName(&local_78,(BinaryReaderIR *)&pMVar9->data_segment_bindings,
                    (BindingHash *)&local_58,name_00._M_str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                 local_58.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::string::_M_assign((string *)&pDVar8->name);
      lVar13 = 0x300;
      goto LAB_0011dd0d;
    }
    pcVar12 = "invalid data segment index: %u";
    break;
  case Last:
    if (name_00._M_str == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppTVar10 = (pMVar9->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar10 >> 3)) {
      pTVar11 = ppTVar10[index];
      name_04._M_str = (char *)name_00._M_str;
      name_04._M_len = (size_t)pcVar12;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_
                (&local_58,(_anonymous_namespace_ *)name_00._M_str,name_04);
      GetUniqueName(&local_78,(BinaryReaderIR *)&pMVar9->tag_bindings,(BindingHash *)&local_58,
                    name_00._M_str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                 local_58.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::string::_M_assign((string *)pTVar11);
      lVar13 = 0x178;
      goto LAB_0011dd0d;
    }
    pcVar12 = "invalid tag index: %u";
  }
  PrintError(this,pcVar12,(ulong)index);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnNameEntry(NameSectionSubsection type,
                                   Index index,
                                   std::string_view name) {
  switch (type) {
    // TODO(sbc): remove OnFunctionName in favor of just using
    // OnNameEntry so that this works
    case NameSectionSubsection::Function:
    case NameSectionSubsection::Local:
    case NameSectionSubsection::Module:
    case NameSectionSubsection::Label:
      break;
    case NameSectionSubsection::Type:
      SetTypeName(index, name);
      break;
    case NameSectionSubsection::Tag:
      SetTagName(index, name);
      break;
    case NameSectionSubsection::Global:
      SetGlobalName(index, name);
      break;
    case NameSectionSubsection::Table:
      SetTableName(index, name);
      break;
    case NameSectionSubsection::DataSegment:
      SetDataSegmentName(index, name);
      break;
    case NameSectionSubsection::Memory:
      SetMemoryName(index, name);
      break;
    case NameSectionSubsection::ElemSegment:
      SetElemSegmentName(index, name);
      break;
  }
  return Result::Ok;
}